

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_draw.cpp
# Opt level: O2

void lsim::gui::component_register_basic(void)

{
  undefined8 local_98;
  undefined8 in_stack_ffffffffffffff70;
  _Manager_type in_stack_ffffffffffffff78;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  ComponentIcon::cache(0,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(lsim::ModelComponent_*,_lsim::gui::ComponentWidget_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/component_draw.cpp:80:33)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(lsim::ModelComponent_*,_lsim::gui::ComponentWidget_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/component_draw.cpp:80:33)>
             ::_M_manager;
  CircuitEditorFactory::register_materialize_func(1,(materialize_func_t *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ComponentIcon::cache(0,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(lsim::ModelComponent_*,_lsim::gui::ComponentWidget_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/component_draw.cpp:153:34)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(lsim::ModelComponent_*,_lsim::gui::ComponentWidget_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/component_draw.cpp:153:34)>
             ::_M_manager;
  CircuitEditorFactory::register_materialize_func(2,(materialize_func_t *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  ComponentIcon::cache(0,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(lsim::ModelComponent_*,_lsim::gui::ComponentWidget_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/component_draw.cpp:212:29)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(lsim::ModelComponent_*,_lsim::gui::ComponentWidget_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/component_draw.cpp:212:29)>
             ::_M_manager;
  CircuitEditorFactory::register_materialize_func(3,(materialize_func_t *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  local_98 = (void *)0x0;
  CircuitEditorFactory::register_materialize_func
            (0x301,(materialize_func_t *)&stack0xffffffffffffff68);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff68);
  return;
}

Assistant:

void component_register_basic() {

    // connector input
    ComponentIcon::cache(COMPONENT_CONNECTOR_IN, SHAPE_CONNECTOR_IN, sizeof(SHAPE_CONNECTOR_IN));
    CircuitEditorFactory::register_materialize_func(
        COMPONENT_CONNECTOR_IN, [](ModelComponent *comp, ComponentWidget *widget) {
            widget->change_tooltip("Input");

            const float width = 20;
            const float pin_spacing = 20;
            const float height = comp->num_outputs() * pin_spacing;
            const bool desc = comp->property_value("descending", false);
            widget->change_size(width, height);
            widget->add_pin_line(comp->output_pin_id(0), comp->num_outputs(),
                                  {0.5f * width, ((-height * 0.5f) + (pin_spacing * 0.5f)) * (desc ? -1.0f : 1.0f)},
                                  {0, pin_spacing * (desc ? -1.0f : 1.0f)});

            // custom draw function
            widget->set_draw_callback([=](CircuitEditor *circuit_editor, const ComponentWidget *widget, Transform to_window) {

                auto model = widget->component_model();

                bool is_tristate = model->property_value("tri_state", false);
                auto origin = Point(-width * 0.5f, -height * 0.5f);
                auto orient = model->angle();
				const Point button_half_size = {8,8};
				const Point button_size = {16,16};

                ImGui::BeginGroup();
                ImGui::PushID(model);

				// connector 'buttons'
                for (auto i = 0u; i < model->num_outputs(); ++ i)
                {
                    auto cur_val = VALUE_FALSE;
                    if (circuit_editor->is_simulating()) {
                        cur_val = circuit_editor->sim_circuit()->user_value(model->output_pin_id(i));
                    }
                    auto center_pos = to_window.apply(Point(0, ((-height * 0.5f) + ((i + 0.5f) * pin_spacing)) * (desc ? -1.0f : 1.0f)));
                    ImGui::SetCursorScreenPos(center_pos - button_half_size);

                    ImGui::PushID(i);
                    if (circuit_editor->is_simulating() && !circuit_editor->is_view_only_simulation() &&
                        ImGui::InvisibleButton(value_label(cur_val), button_size)) {
                        cur_val = static_cast<Value>((cur_val + 1) % (is_tristate ? 3 : 2));
                        circuit_editor->sim_circuit()->write_pin(model->output_pin_id(i), cur_val);
                    }

                    ImGuiEx::RectFilled(center_pos - button_half_size, center_pos + button_half_size, COLOR_CONNECTION[cur_val]);
                    if (circuit_editor->is_simulating()) {
                        ImGuiEx::Text(center_pos, value_label(cur_val), ImGuiEx::TAH_CENTER, ImGuiEx::TAV_CENTER);
                    } else {
                        ImGuiEx::Text(center_pos, std::to_string(i), ImGuiEx::TAH_CENTER, ImGuiEx::TAV_CENTER);
                    }
                    ImGui::PopID();
                }
                ImGui::PopID();

                // label for connector
                Point anchor = to_window.apply(Point(origin.x - 5, origin.y + (height / 2.0f)));

                static const std::pair<ImGuiEx::TextAlignHor, ImGuiEx::TextAlignVer> label_align[] = {
                    {ImGuiEx::TAH_RIGHT,    ImGuiEx::TAV_CENTER},   // East
                    {ImGuiEx::TAH_CENTER,   ImGuiEx::TAV_BOTTOM},   // South
                    {ImGuiEx::TAH_LEFT,     ImGuiEx::TAV_CENTER},   // West
                    {ImGuiEx::TAH_CENTER,   ImGuiEx::TAV_TOP}       // North
                };

                ImGuiEx::Text(anchor, model->property_value("name","").c_str(), label_align[orient / 90].first, label_align[orient / 90].second);

                ImGui::EndGroup();
            });
        }
    );

    // connector output
    ComponentIcon::cache(COMPONENT_CONNECTOR_OUT, SHAPE_CONNECTOR_OUT, sizeof(SHAPE_CONNECTOR_OUT));
    CircuitEditorFactory::register_materialize_func(
        COMPONENT_CONNECTOR_OUT, [=](ModelComponent *comp, ComponentWidget *widget) {
            widget->change_tooltip("Output");

            const float width = 20;
            const float pin_spacing = 20;
            const float height = comp->num_inputs() * pin_spacing;
            const bool desc = comp->property_value("descending", false);
            widget->change_size(width, height);
            widget->add_pin_line(comp->input_pin_id(0), comp->num_inputs(),
                                  {-0.5f * width, (-height * 0.5f + (pin_spacing * 0.5f)) * (desc ? -1.0f : 1.0f)},
                                  {0, desc ? -pin_spacing : pin_spacing});

            // custom draw function
            widget->set_draw_callback([=](CircuitEditor *circuit_editor, const ComponentWidget *widget, Transform to_window) {

                auto origin = Point(-width * 0.5f, -height * 0.5f);
                auto orient = widget->component_model()->angle();
				const Point button_half_size = {8,8};

                ImGui::BeginGroup();
                ImGui::PushID(comp);
                for (auto i = 0u; i < comp->num_inputs(); ++ i) {
                    auto cur_val = VALUE_FALSE;
                    if (circuit_editor->is_simulating()) {
                        cur_val = circuit_editor->sim_circuit()->read_pin(comp->input_pin_id(i));
                    }
                    auto center_pos = to_window.apply(Point(0, ((-height * 0.5f) + ((i + 0.5f) * pin_spacing)) * (desc ? -1.0f : 1.0f)));

                    ImGui::PushID(i);
                    ImGuiEx::RectFilled(center_pos - button_half_size, center_pos + button_half_size, COLOR_CONNECTION[cur_val]);
                    if (circuit_editor->is_simulating()) {
                        ImGuiEx::Text(center_pos, value_label(cur_val), ImGuiEx::TAH_CENTER, ImGuiEx::TAV_CENTER);
                    } else {
                        ImGuiEx::Text(center_pos, std::to_string(i), ImGuiEx::TAH_CENTER, ImGuiEx::TAV_CENTER);
                    }
                    ImGui::PopID();
                }
                ImGui::PopID();

                // label for connector
                Point anchor = to_window.apply(origin + Point(width + 5, (height / 2.0f)));

                static const std::pair<ImGuiEx::TextAlignHor, ImGuiEx::TextAlignVer> label_align[] = {
                    {ImGuiEx::TAH_LEFT,     ImGuiEx::TAV_CENTER},   // East
                    {ImGuiEx::TAH_CENTER,   ImGuiEx::TAV_TOP},      // South
                    {ImGuiEx::TAH_RIGHT,    ImGuiEx::TAV_CENTER},   // West
                    {ImGuiEx::TAH_CENTER,   ImGuiEx::TAV_BOTTOM}    // North
                };
                ImGuiEx::Text(anchor, comp->property_value("name", "").c_str(), label_align[orient / 90].first, label_align[orient / 90].second);

                ImGui::EndGroup();
            });
        }
    );


    // constant
    ComponentIcon::cache(COMPONENT_CONSTANT, SHAPE_CONSTANT, sizeof(SHAPE_CONSTANT));
    CircuitEditorFactory::register_materialize_func(
        COMPONENT_CONSTANT, [=](ModelComponent *comp, ComponentWidget *widget) {
            const float width = 20;
            const float height = 20;
            widget->change_size(width, height);
            widget->add_pin_line(comp->output_pin_id(0), comp->num_outputs(), 
                                  {0.5f * width, (-height * 0.5f) + (height * 0.5f)}, 
                                  {0, height});

            // custom draw function
            widget->set_draw_callback([=](CircuitEditor *circuit_editor, const ComponentWidget *widget, Transform to_window) {
                auto val = comp->property_value("value", VALUE_FALSE);
                auto center_pos = to_window.apply(Point(0.0f, 0.0f));
                ImGuiEx::RectFilled(center_pos - Point(8,8), center_pos + Point(8,8), COLOR_CONNECTION[val]);
                ImGuiEx::Text(center_pos, value_label(val), ImGuiEx::TAH_CENTER, ImGuiEx::TAV_CENTER);
            });
        }
    );

    // sub circuit
    CircuitEditorFactory::register_materialize_func(
        COMPONENT_SUB_CIRCUIT, [=](ModelComponent *comp, ComponentWidget *widget) {
            auto nested = widget->component_model()->nested_circuit();

            // materialize the sub-circuit
            bool flip = comp->property_value("flip", false);
            float width = 160;
            float height = (std::max(nested->num_input_ports(), nested->num_output_ports()) + 1) * 20.0f + 20.0f;

            widget->change_size(width, height);
            if (comp->num_inputs() > 0) {
                widget->add_pin_line(comp->input_pin_id(0), comp->num_inputs(),
                                    {(flip ? 1.0f : -1.0f) * width/2.0f, -height/2.0f + 20}, {0.0f, 20.0f});
            }
            if (comp->num_outputs() > 0) {
                widget->add_pin_line(comp->output_pin_id(0), comp->num_outputs(),
                                    {(flip ? -1.0f : 1.0f) * width/2.0f, -height/2.0f + 20}, {0.0f, 20.0f});
            }

            // custom draw function for pin labels
            widget->set_draw_callback([=](CircuitEditor *circuit_editor, const ComponentWidget *widget, Transform to_window) {

                ImGuiEx::TransformStart();

                auto pos = [=](bool flipped) {
                    return Point(-(width * 0.5f) + 10 + (static_cast<float>(flipped) * (width - 20)), (-height * 0.5f) + 20);
                };

                auto align = [](bool flipped) {
                    return !flipped ? ImGuiEx::TAH_LEFT : ImGuiEx::TAH_RIGHT;
                };

                // input pins - labels
                auto cursor = pos(flip);
                for (auto idx = 0u; idx < nested->num_input_ports(); ++idx) {
                    ImGuiEx::TextNoClip(cursor, nested->port_name(true, idx), COLOR_COMPONENT_BORDER, align(flip), ImGuiEx::TAV_CENTER);
                    cursor.y += 20;
                }

                // output pins - labels
                cursor = pos(!flip);
                for (auto idx = 0u; idx < nested->num_output_ports(); ++idx) {
                    ImGuiEx::TextNoClip(cursor, nested->port_name(false, idx), COLOR_COMPONENT_BORDER, align(!flip), ImGuiEx::TAV_CENTER);
                    cursor.y += 20;
                }

                // caption
                ImGuiEx::RectFilled(Point(-width * 0.5f, (height * 0.5f) - 20), 
                                    Point(width * 0.5f, (height * 0.5f)), 
                                    COLOR_COMPONENT_BORDER);
                cursor = Point(0, (height * 0.5f) - 10);
                ImGuiEx::TextNoClip(cursor, comp->property_value("caption", "unknown"), IM_COL32(0,0,0,255), ImGuiEx::TAH_CENTER, ImGuiEx::TAV_CENTER);

                ImGuiEx::TransformEnd(to_window);
            });
        }
    ); 
}